

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O2

BOOL __thiscall
Js::ModuleRoot::SetAccessors
          (ModuleRoot *this,PropertyId propertyId,Var getter,Var setter,PropertyOperationFlags flags
          )

{
  HostObjectBase *pHVar1;
  BOOL BVar2;
  
  BVar2 = DynamicObject::SetAccessors((DynamicObject *)this,propertyId,getter,setter,flags);
  if (BVar2 != 0) {
    return 1;
  }
  pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
  if (pHVar1 != (HostObjectBase *)0x0) {
    BVar2 = (**(code **)(*(long *)pHVar1 + 0x168))(pHVar1,propertyId,getter,setter,flags);
    return BVar2;
  }
  BVar2 = GlobalObject::SetAccessors
                    ((((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                           type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr)->super_ScriptContextBase).globalObject,propertyId,getter,
                     setter,flags);
  return BVar2;
}

Assistant:

BOOL ModuleRoot::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (DynamicObject::SetAccessors(propertyId, getter, setter, flags))
        {
            return TRUE;
        }
        if (this->hostObject)
        {
            return this->hostObject->SetAccessors(propertyId, getter, setter, flags);
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //
        GlobalObject* globalObj = GetScriptContext()->GetGlobalObject();
        return globalObj->GlobalObject::SetAccessors(propertyId, getter, setter, flags);
    }